

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O2

void __thiscall Clone_modelWithUnits_Test::TestBody(Clone_modelWithUnits_Test *this)

{
  string *psVar1;
  ModelPtr mClone;
  ModelPtr m;
  UnitsPtr u;
  allocator<char> local_49;
  string local_48 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40 [3];
  string *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_20;
  string *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_10;
  
  libcellml::Model::create();
  libcellml::Units::create();
  std::__cxx11::string::string<std::allocator<char>>(local_48,"jangle",&local_49);
  libcellml::NamedEntity::setName(local_18);
  std::__cxx11::string::~string(local_48);
  psVar1 = local_28;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"unique_model",&local_49);
  libcellml::Entity::setId(psVar1);
  std::__cxx11::string::~string(local_48);
  psVar1 = local_28;
  std::__cxx11::string::string<std::allocator<char>>(local_48,"model",&local_49);
  libcellml::NamedEntity::setName(psVar1);
  std::__cxx11::string::~string(local_48);
  libcellml::Model::addUnits((shared_ptr *)local_28);
  libcellml::Model::clone();
  compareModel((shared_ptr *)&local_28,(shared_ptr *)local_48);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_40);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_10);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20);
  return;
}

Assistant:

TEST(Clone, modelWithUnits)
{
    auto m = libcellml::Model::create();
    auto u = libcellml::Units::create();

    u->setName("jangle");
    m->setId("unique_model");
    m->setName("model");

    m->addUnits(u);

    auto mClone = m->clone();

    compareModel(m, mClone);
}